

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O1

void __thiscall
pica::Grid<(pica::Dimension)2,_double>::Grid
          (Grid<(pica::Dimension)2,_double> *this,PositionType *origin,PositionType *step,
          IndexType *size)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  vector<double,_std::allocator<double>_> *this_00;
  IndexType IVar2;
  double dVar3;
  allocator_type local_69;
  value_type local_68;
  vector<double,_std::allocator<double>_> *local_60;
  vector<double,_std::allocator<double>_> *local_58;
  vector<double,_std::allocator<double>_> *local_50;
  vector<double,_std::allocator<double>_> *local_48;
  PositionType *local_40;
  PositionType *local_38;
  
  IVar2 = *size;
  local_68 = 0.0;
  (this->exData).size.x = IVar2.x;
  (this->exData).size.y = IVar2.y;
  pvVar1 = &(this->exData).data;
  local_40 = origin;
  local_38 = step;
  std::vector<double,_std::allocator<double>_>::vector
            (pvVar1,(long)(IVar2.y * IVar2.x),&local_68,&local_69);
  IVar2 = *size;
  local_68 = 0.0;
  (this->eyData).size.x = IVar2.x;
  (this->eyData).size.y = IVar2.y;
  this_00 = &(this->eyData).data;
  local_48 = pvVar1;
  std::vector<double,_std::allocator<double>_>::vector
            (this_00,(long)(IVar2.y * IVar2.x),&local_68,&local_69);
  IVar2 = *size;
  local_68 = 0.0;
  (this->ezData).size.x = IVar2.x;
  (this->ezData).size.y = IVar2.y;
  pvVar1 = &(this->ezData).data;
  local_50 = this_00;
  std::vector<double,_std::allocator<double>_>::vector
            (pvVar1,(long)(IVar2.y * IVar2.x),&local_68,&local_69);
  IVar2 = *size;
  local_68 = 0.0;
  (this->bxData).size.x = IVar2.x;
  (this->bxData).size.y = IVar2.y;
  local_60 = &(this->bxData).data;
  local_58 = pvVar1;
  std::vector<double,_std::allocator<double>_>::vector
            (local_60,(long)(IVar2.y * IVar2.x),&local_68,&local_69);
  IVar2 = *size;
  local_68 = 0.0;
  (this->byData).size.x = IVar2.x;
  (this->byData).size.y = IVar2.y;
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->byData).data,(long)(IVar2.y * IVar2.x),&local_68,&local_69);
  IVar2 = *size;
  local_68 = 0.0;
  (this->bzData).size.x = IVar2.x;
  (this->bzData).size.y = IVar2.y;
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->bzData).data,(long)(IVar2.y * IVar2.x),&local_68,&local_69);
  IVar2 = *size;
  local_68 = 0.0;
  (this->jxData).size.x = IVar2.x;
  (this->jxData).size.y = IVar2.y;
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->jxData).data,(long)(IVar2.y * IVar2.x),&local_68,&local_69);
  IVar2 = *size;
  local_68 = 0.0;
  (this->jyData).size.x = IVar2.x;
  (this->jyData).size.y = IVar2.y;
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->jyData).data,(long)(IVar2.y * IVar2.x),&local_68,&local_69);
  IVar2 = *size;
  local_68 = 0.0;
  (this->jzData).size.x = IVar2.x;
  (this->jzData).size.y = IVar2.y;
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->jzData).data,(long)(IVar2.y * IVar2.x),&local_68,&local_69);
  dVar3 = local_40->y;
  (this->origin).x = local_40->x;
  (this->origin).y = dVar3;
  dVar3 = local_38->y;
  (this->step).x = local_38->x;
  (this->step).y = dVar3;
  return;
}

Assistant:

Grid(const PositionType& origin, const PositionType& step, const IndexType& size) :
        exData(size),
        eyData(size),
        ezData(size),
        bxData(size),
        byData(size),
        bzData(size),
        jxData(size),
        jyData(size),
        jzData(size),
        origin(origin),
        step(step) {}